

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  byte bVar5;
  ImGuiContext *g;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar12;
  undefined1 auVar11 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 size_auto_fit;
  ImVec2 local_48;
  float local_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  ImVec2 IVar10;
  
  pIVar3 = GImGui;
  local_38 = ZEXT816(0);
  if ((window->Flags & 1) == 0) {
    fVar8 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar8 = fVar8 * window->ParentWindow->FontWindowScale;
    }
    fVar9 = (GImGui->Style).FramePadding.y;
    local_38 = ZEXT416((uint)(fVar9 + fVar9 + fVar8));
  }
  fVar9 = ImGuiWindow::MenuBarHeight(window);
  fVar8 = (window->WindowPadding).x;
  fVar8 = fVar8 + fVar8;
  local_28 = ZEXT416((uint)fVar8);
  local_3c = (window->WindowPadding).y;
  local_3c = local_3c + local_3c;
  fVar8 = size_contents->x + fVar8;
  fVar15 = fVar9 + (float)local_38._0_4_ + size_contents->y + local_3c;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    local_38._4_4_ = extraout_XMM0_Db;
    local_38._0_4_ = fVar9 + (float)local_38._0_4_;
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._12_4_ = extraout_XMM0_Dd;
    IVar10 = (pIVar3->Style).WindowMinSize;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = IVar10.x;
    auVar11._4_4_ = IVar10.y;
    IVar1 = (pIVar3->Style).DisplaySafeAreaPadding;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar11 = minps(auVar11,_DAT_0017b800);
      IVar10 = auVar11._0_8_;
    }
    IVar2 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).Size;
    fVar12 = IVar1.x;
    fVar9 = IVar1.y;
    fVar13 = IVar2.x - (fVar12 + fVar12);
    fVar14 = IVar2.y - (fVar9 + fVar9);
    fVar9 = IVar10.x;
    fVar12 = IVar10.y;
    uVar6 = -(uint)(fVar13 <= fVar9);
    uVar7 = -(uint)(fVar14 <= fVar12);
    fVar13 = (float)(~uVar6 & (uint)fVar13 | (uint)fVar9 & uVar6);
    fVar14 = (float)(~uVar7 & (uint)fVar14 | (uint)fVar12 & uVar7);
    uVar6 = -(uint)(fVar13 < fVar8);
    uVar7 = -(uint)(fVar14 < fVar15);
    local_48 = (ImVec2)(CONCAT44(~-(uint)(fVar15 < fVar12) &
                                 (~uVar7 & (uint)fVar15 | (uint)fVar14 & uVar7),
                                 ~-(uint)(fVar8 < fVar9) &
                                 (~uVar6 & (uint)(fVar8 + 0.0) | (uint)fVar13 & uVar6)) |
                       CONCAT44((uint)fVar12 & -(uint)(fVar15 < fVar12),
                                (uint)fVar9 & -(uint)(fVar8 < fVar9)));
    IVar10 = CalcWindowSizeAfterConstraint(window,&local_48);
    if ((size_contents->x <= IVar10.x - (float)local_28._0_4_) ||
       (bVar4 = 1, (window->Flags & 0x808U) != 0x800)) {
      bVar4 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar10.y - local_3c) - (float)local_38._0_4_) ||
       (bVar5 = 1, (window->Flags & 8) != 0)) {
      bVar5 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    if (bVar4 != 0) {
      local_48.y = (pIVar3->Style).ScrollbarSize + local_48.y;
    }
    if (bVar5 != 0) {
      local_48.x = (pIVar3->Style).ScrollbarSize + local_48.x;
    }
  }
  else {
    local_48.y = fVar15;
    local_48.x = fVar8 + 0.0;
  }
  return local_48;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}